

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O1

size_t mpeg_bitstream_parse
                 (mpeg_bitstream_t *packet,caption_frame_t *frame,uint8_t *data,size_t size,
                 uint stream_type,double dts,double cts)

{
  uint8_t *__dest;
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  sei_message_t *__ptr;
  byte bVar4;
  libcaption_stauts_t lVar5;
  libcaption_stauts_t lVar6;
  libcaption_stauts_t lVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  cea708_t *pcVar11;
  _sei_message_t *p_Var12;
  double timestamp;
  sei_t local_78;
  uint8_t *local_58;
  size_t local_50;
  uint8_t *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar2 = packet->size;
  if (uVar2 < 0x600000) {
    sVar9 = 0x600000 - uVar2;
    if (uVar2 + size < 0x600000) {
      sVar9 = size;
    }
    packet->status = LIBCAPTION_OK;
    memcpy(packet->data + uVar2,data,sVar9);
    packet->size = packet->size + sVar9;
    local_50 = sVar9;
    if (packet->status == LIBCAPTION_OK) {
      __dest = packet->data;
      local_40 = 4;
      if (stream_type != 0x1b) {
        local_40 = (ulong)(stream_type == 0x24) * 5;
      }
      local_48 = __dest + local_40;
      timestamp = cts + dts;
      local_58 = packet->data + 4;
      local_38 = (ulong)(stream_type == 0x24 || stream_type == 0x1b) ^ 1;
      do {
        uVar2 = packet->size;
        if (1 < uVar2) {
          uVar8 = 0xffffffff;
          uVar10 = 0xfffffffffffffffe;
          do {
            if (uVar8 << 8 == 0x100) goto LAB_00107063;
            uVar8 = uVar8 << 8 | (uint)packet->data[uVar10 + 3];
            lVar1 = uVar10 - uVar2;
            uVar10 = uVar10 + 1;
          } while (lVar1 != -4);
        }
        uVar10 = 0;
LAB_00107063:
        if (uVar10 == 0) {
          return local_50;
        }
        if (uVar2 < 4) {
LAB_00107076:
          bVar4 = 0;
        }
        else if (stream_type == 0x24) {
          bVar4 = packet->data[3] >> 1 & 0x3f;
        }
        else if (stream_type == 0x1b) {
          bVar4 = packet->data[3] & 0x1f;
        }
        else {
          if (stream_type != 2) goto LAB_00107076;
          bVar4 = packet->data[3];
        }
        if ((bVar4 == 6) || (bVar4 == 0x27)) {
          if ((local_40 <= uVar10 && uVar10 - local_40 != 0) && (char)local_38 == '\0') {
            lVar6 = sei_parse(&local_78,local_48,uVar10 - local_40,timestamp);
            packet->status = lVar6;
            for (p_Var12 = local_78.head; __ptr = local_78.head, p_Var12 != (sei_message_t *)0x0;
                p_Var12 = p_Var12->next) {
              if (p_Var12->type == sei_type_user_data_registered_itu_t_t35) {
                sVar3 = packet->latent;
                packet->latent = sVar3 + 1;
                pcVar11 = (cea708_t *)
                          ((long)(packet->cea708[0].user_data.cc_data + -5) +
                          (ulong)(((int)sVar3 + (int)packet->front & 0x3fU) * 0xa0));
                cea708_init(pcVar11,timestamp);
                lVar6 = packet->status;
                lVar5 = cea708_parse_h264((uint8_t *)(p_Var12 + 1),p_Var12->size,pcVar11);
                lVar7 = lVar5;
                if (lVar6 == LIBCAPTION_READY) {
                  lVar7 = lVar6;
                }
                if (lVar5 == LIBCAPTION_ERROR) {
                  lVar7 = lVar5;
                }
                if (lVar6 == LIBCAPTION_ERROR) {
                  lVar7 = lVar6;
                }
                packet->status = lVar7;
                _mpeg_bitstream_cea708_sort_flush(packet,frame,dts);
              }
            }
            while (__ptr != (sei_message_t *)0x0) {
              p_Var12 = __ptr->next;
              free(__ptr);
              __ptr = p_Var12;
            }
            local_78.timestamp = 0.0;
            local_78.head = (sei_message_t *)0x0;
            local_78.tail = (sei_message_t *)0x0;
          }
        }
        else if ((bVar4 == 0xb2) && (4 < uVar10 && stream_type == 2)) {
          sVar3 = packet->latent;
          packet->latent = sVar3 + 1;
          pcVar11 = (cea708_t *)
                    ((long)(packet->cea708[0].user_data.cc_data + -5) +
                    (ulong)(((int)sVar3 + (int)packet->front & 0x3fU) * 0xa0));
          cea708_init(pcVar11,timestamp);
          lVar6 = packet->status;
          lVar5 = cea708_parse_h262(local_58,uVar10 - 4,pcVar11);
          lVar7 = lVar5;
          if (lVar6 == LIBCAPTION_READY) {
            lVar7 = lVar6;
          }
          if (lVar5 == LIBCAPTION_ERROR) {
            lVar7 = lVar5;
          }
          if (lVar6 == LIBCAPTION_ERROR) {
            lVar7 = lVar6;
          }
          packet->status = lVar7;
          _mpeg_bitstream_cea708_sort_flush(packet,frame,dts);
        }
        sVar9 = packet->size - uVar10;
        packet->size = sVar9;
        memmove(__dest,__dest + uVar10,sVar9);
      } while (packet->status == LIBCAPTION_OK);
    }
  }
  else {
    packet->status = LIBCAPTION_ERROR;
    local_50 = 0;
  }
  return local_50;
}

Assistant:

size_t mpeg_bitstream_parse(mpeg_bitstream_t* packet, caption_frame_t* frame, const uint8_t* data, size_t size, unsigned stream_type, double dts, double cts)
{
    if (MAX_NALU_SIZE <= packet->size) {
        packet->status = LIBCAPTION_ERROR;
        // fprintf(stderr, "LIBCAPTION_ERROR\n");
        return 0;
    }

    // consume upto MAX_NALU_SIZE bytes
    if (MAX_NALU_SIZE <= packet->size + size) {
        size = MAX_NALU_SIZE - packet->size;
    }

    sei_t sei;
    size_t header_size, scpos;
    packet->status = LIBCAPTION_OK;
    memcpy(&packet->data[packet->size], data, size);
    packet->size += size;

    while (packet->status == LIBCAPTION_OK && 0 < (scpos = find_start_code(&packet->data[0], packet->size))) {
        switch (mpeg_bitstream_packet_type(packet, stream_type)) {
        default:
            break;
        case H262_SEI_PACKET:
            header_size = 4;
            if (STREAM_TYPE_H262 == stream_type && scpos > header_size) {
                cea708_t* cea708 = _mpeg_bitstream_cea708_emplace_back(packet, dts + cts);
                packet->status = libcaption_status_update(packet->status, cea708_parse_h262(&packet->data[header_size], scpos - header_size, cea708));
                _mpeg_bitstream_cea708_sort_flush(packet, frame, dts);
            }
            break;
        case H264_SEI_PACKET:
        case H265_SEI_PACKET:
            header_size = STREAM_TYPE_H264 == stream_type ? 4 : STREAM_TYPE_H265 == stream_type ? 5 : 0;
            if (header_size && scpos > header_size) {
                packet->status = libcaption_status_update(packet->status, sei_parse(&sei, &packet->data[header_size], scpos - header_size, dts + cts));
                for (sei_message_t* msg = sei_message_head(&sei); msg; msg = sei_message_next(msg)) {
                    if (sei_type_user_data_registered_itu_t_t35 == sei_message_type(msg)) {
                        cea708_t* cea708 = _mpeg_bitstream_cea708_emplace_back(packet, dts + cts);
                        packet->status = libcaption_status_update(packet->status, cea708_parse_h264(sei_message_data(msg), sei_message_size(msg), cea708));
                        _mpeg_bitstream_cea708_sort_flush(packet, frame, dts);
                    }
                }
                sei_free(&sei);
            }
            break;
        }

        packet->size -= scpos;
        memmove(&packet->data[0], &packet->data[scpos], packet->size);
    }

    return size;
}